

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcContain.c
# Opt level: O3

int Mvc_CoverContain(Mvc_Cover_t *pCover)

{
  int *piVar1;
  bool bVar2;
  Mvc_Cube_t *pMVar3;
  Mvc_Cube_t *pCube;
  int iVar4;
  uint uVar5;
  int iVar6;
  Mvc_Cube_t *pMVar7;
  Mvc_Cube_t *pMVar8;
  Mvc_Cube_t *pMVar9;
  Mvc_Cube_t *pMVar10;
  
  iVar4 = Mvc_CoverReadCubeNum(pCover);
  if (iVar4 < 2) {
    return 0;
  }
  Mvc_CoverSetCubeSizes(pCover);
  Mvc_CoverSort(pCover,(Mvc_Cube_t *)0x0,Mvc_CubeCompareSizeAndInt);
  pMVar7 = Mvc_CoverReadCubeHead(pCover);
  pMVar8 = pMVar7->pNext;
joined_r0x0040b6c0:
  do {
    pMVar9 = pMVar7;
    pMVar7 = pMVar8;
    if (pMVar7 == (Mvc_Cube_t *)0x0) {
      pMVar8 = Mvc_CoverReadCubeHead(pCover);
      do {
        pMVar7 = pMVar8;
        do {
          pMVar9 = pMVar7;
          pMVar7 = pMVar9->pNext;
          if (pMVar7 == (Mvc_Cube_t *)0x0) goto LAB_0040b841;
        } while (pMVar8->nOnes == pMVar7->nOnes);
        if (pMVar8 != (Mvc_Cube_t *)0x0) {
          do {
            pMVar7 = pMVar9->pNext;
            pCube = pMVar9;
joined_r0x0040b786:
            pMVar3 = pCube;
            pCube = pMVar7;
            if (pCube != (Mvc_Cube_t *)0x0) {
              pMVar7 = pCube->pNext;
              uVar5 = *(uint *)&pCube->field_0x8 & 0xffffff;
              if (uVar5 == 0) {
                uVar5 = ~pMVar8->pData[0] & pCube->pData[0];
LAB_0040b7e1:
                if (uVar5 == 0) goto LAB_0040b7ea;
              }
              else {
                if (uVar5 != 1) goto LAB_0040b7be;
                if ((pCube->pData[0] & ~pMVar8->pData[0]) == 0) {
                  uVar5 = (uint)((*(uint *)&pCube->field_0x14 & ~*(uint *)&pMVar8->field_0x14) != 0)
                  ;
                  goto LAB_0040b7e1;
                }
              }
              goto joined_r0x0040b786;
            }
          } while ((pMVar8 != pMVar9) && (pMVar8 = pMVar8->pNext, pMVar8 != (Mvc_Cube_t *)0x0));
          pMVar7 = pMVar9->pNext;
        }
        pMVar8 = pMVar7;
      } while (pMVar7 != (Mvc_Cube_t *)0x0);
LAB_0040b841:
      iVar6 = Mvc_CoverReadCubeNum(pCover);
      return (uint)(iVar4 != iVar6);
    }
    pMVar8 = pMVar7->pNext;
    uVar5 = *(uint *)&pMVar9->field_0x8 & 0xffffff;
    if (uVar5 == 0) goto LAB_0040b709;
    if (uVar5 != 1) {
      do {
        if (pMVar9->pData[uVar5] != pMVar7->pData[uVar5]) goto joined_r0x0040b6c0;
        bVar2 = 0 < (int)uVar5;
        uVar5 = uVar5 - 1;
      } while (bVar2);
      break;
    }
  } while ((pMVar9->pData[0] != pMVar7->pData[0]) ||
          (*(int *)&pMVar9->field_0x14 != *(int *)&pMVar7->field_0x14));
LAB_0040b712:
  pMVar9->pNext = pMVar8;
  if ((pCover->lCubes).pTail == pMVar7) {
    if (pMVar8 != (Mvc_Cube_t *)0x0) {
      __assert_fail("pCube->pNext == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcContain.c"
                    ,0x56,"void Mvc_CoverRemoveDuplicates(Mvc_Cover_t *)");
    }
    (pCover->lCubes).pTail = pMVar9;
  }
  piVar1 = &(pCover->lCubes).nItems;
  *piVar1 = *piVar1 + -1;
  Mvc_CubeFree(pCover,pMVar7);
  pMVar7 = pMVar9;
  goto joined_r0x0040b6c0;
LAB_0040b7be:
  do {
    if ((pCube->pData[uVar5] & ~pMVar8->pData[uVar5]) != 0) goto joined_r0x0040b786;
    bVar2 = 0 < (int)uVar5;
    uVar5 = uVar5 - 1;
  } while (bVar2);
LAB_0040b7ea:
  pMVar10 = pMVar3;
  if (pMVar3 == (Mvc_Cube_t *)0x0) {
    pMVar10 = (Mvc_Cube_t *)&pCover->lCubes;
  }
  pMVar10->pNext = pMVar7;
  if ((pCover->lCubes).pTail == pCube) {
    if (pMVar7 != (Mvc_Cube_t *)0x0) {
      __assert_fail("pCube->pNext == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcContain.c"
                    ,0x97,"void Mvc_CoverRemoveContained(Mvc_Cover_t *)");
    }
    (pCover->lCubes).pTail = pMVar3;
  }
  piVar1 = &(pCover->lCubes).nItems;
  *piVar1 = *piVar1 + -1;
  Mvc_CubeFree(pCover,pCube);
  pCube = pMVar3;
  goto joined_r0x0040b786;
LAB_0040b709:
  if (pMVar9->pData[0] != pMVar7->pData[0]) goto joined_r0x0040b6c0;
  goto LAB_0040b712;
}

Assistant:

int  Mvc_CoverContain( Mvc_Cover_t * pCover )
{
    int nCubes;
    nCubes = Mvc_CoverReadCubeNum( pCover );
    if ( nCubes < 2 )
        return 0;
    Mvc_CoverSetCubeSizes(pCover);
    Mvc_CoverSort( pCover, NULL, Mvc_CubeCompareSizeAndInt );
    Mvc_CoverRemoveDuplicates( pCover );
    if ( nCubes > 1 )
        Mvc_CoverRemoveContained( pCover );
    return (nCubes != Mvc_CoverReadCubeNum(pCover));
}